

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O0

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  size_type in_RCX;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  size_type extraout_RDX_07;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  string_view filename_07;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  filenames_GetBasename_Test *local_10;
  filenames_GetBasename_Test *this_local;
  
  local_10 = this;
  wabt::string_view::string_view(&local_30,"/bar/dir/foo.txt");
  filename.size_ = extraout_RDX;
  filename.data_ = (char *)local_30.size_;
  local_20 = wabt::GetBasename((wabt *)local_30.data_,filename);
  sv.size_ = in_RCX;
  sv.data_ = (char *)local_20.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_20.data_,sv);
  wabt::string_view::string_view(&local_50,"bar/dir/foo.txt");
  filename_00.size_ = extraout_RDX_00;
  filename_00.data_ = (char *)local_50.size_;
  local_40 = wabt::GetBasename((wabt *)local_50.data_,filename_00);
  sv_00.size_ = in_RCX;
  sv_00.data_ = (char *)local_40.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_40.data_,sv_00);
  wabt::string_view::string_view(&local_70,"/foo.txt");
  filename_01.size_ = extraout_RDX_01;
  filename_01.data_ = (char *)local_70.size_;
  local_60 = wabt::GetBasename((wabt *)local_70.data_,filename_01);
  sv_01.size_ = in_RCX;
  sv_01.data_ = (char *)local_60.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_60.data_,sv_01);
  wabt::string_view::string_view(&local_90,"\\bar\\dir\\foo.txt");
  filename_02.size_ = extraout_RDX_02;
  filename_02.data_ = (char *)local_90.size_;
  local_80 = wabt::GetBasename((wabt *)local_90.data_,filename_02);
  sv_02.size_ = in_RCX;
  sv_02.data_ = (char *)local_80.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_80.data_,sv_02);
  wabt::string_view::string_view(&local_b0,"bar\\dir\\foo.txt");
  filename_03.size_ = extraout_RDX_03;
  filename_03.data_ = (char *)local_b0.size_;
  local_a0 = wabt::GetBasename((wabt *)local_b0.data_,filename_03);
  sv_03.size_ = in_RCX;
  sv_03.data_ = (char *)local_a0.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_a0.data_,sv_03);
  wabt::string_view::string_view(&local_d0,"\\foo.txt");
  filename_04.size_ = extraout_RDX_04;
  filename_04.data_ = (char *)local_d0.size_;
  local_c0 = wabt::GetBasename((wabt *)local_d0.data_,filename_04);
  sv_04.size_ = in_RCX;
  sv_04.data_ = (char *)local_c0.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_c0.data_,sv_04);
  wabt::string_view::string_view(&local_f0,"foo.txt");
  filename_05.size_ = extraout_RDX_05;
  filename_05.data_ = (char *)local_f0.size_;
  local_e0 = wabt::GetBasename((wabt *)local_f0.data_,filename_05);
  sv_05.size_ = in_RCX;
  sv_05.data_ = (char *)local_e0.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dd64a,local_e0.data_,sv_05);
  wabt::string_view::string_view(&local_110,"foo");
  filename_06.size_ = extraout_RDX_06;
  filename_06.data_ = (char *)local_110.size_;
  local_100 = wabt::GetBasename((wabt *)local_110.data_,filename_06);
  sv_06.size_ = in_RCX;
  sv_06.data_ = (char *)local_100.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4eb170,local_100.data_,sv_06);
  wabt::string_view::string_view(&local_130,"");
  filename_07.size_ = extraout_RDX_07;
  filename_07.data_ = (char *)local_130.size_;
  local_120 = wabt::GetBasename((wabt *)local_130.data_,filename_07);
  sv_07.size_ = in_RCX;
  sv_07.data_ = (char *)local_120.size_;
  anon_unknown.dwarf_8282a::assert_string_view_eq
            ((anon_unknown_dwarf_8282a *)0x4dffbf,local_120.data_,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}